

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.cc
# Opt level: O3

t_operand __thiscall
xemmai::ast::t_while::f_emit(t_while *this,t_emit *a_emit,bool a_tail,bool a_operand,bool a_clear)

{
  t_block *a_junction;
  t_block *a_junction_00;
  t_node *ptVar1;
  t_targets *ptVar2;
  pointer puVar3;
  reference a_label;
  reference a_label_00;
  reference pvVar4;
  anon_union_8_4_0f1077ea_for_t_operand_2 extraout_RDX;
  const_iterator __end2;
  const_iterator __begin2;
  pointer puVar5;
  t_operand tVar6;
  void *local_88;
  t_targets local_80;
  
  a_junction = &this->v_junction_condition;
  t_emit::f_join(a_emit,a_junction);
  a_label = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
            emplace_back<>(a_emit->v_labels);
  a_label->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  t_emit::f_merge(a_emit,a_junction);
  ptVar1 = (this->v_condition)._M_t.
           super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
           _M_t.
           super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>.
           super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
  (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,0);
  a_label_00 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
               emplace_back<>(a_emit->v_labels);
  a_emit->v_stack = a_emit->v_stack - 1;
  local_80.v_break = (t_label *)t_code::v_labels[1];
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             &local_80.v_break);
  local_80.v_break = (t_label *)a_emit->v_stack;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,
             &local_80.v_break);
  t_emit::operator<<(a_emit,a_label_00);
  ptVar2 = a_emit->v_targets;
  pvVar4 = std::deque<xemmai::t_emit::t_label,_std::allocator<xemmai::t_emit::t_label>_>::
           emplace_back<>(a_emit->v_labels);
  a_junction_00 = &this->v_junction_exit;
  local_80.v_break_stack = a_emit->v_stack;
  local_80.v_return._0_4_ = *(undefined4 *)&ptVar2->v_return;
  local_80.v_return._4_4_ = *(undefined4 *)((long)&ptVar2->v_return + 4);
  local_80.v_return_junction._0_4_ = *(undefined4 *)&ptVar2->v_return_junction;
  local_80.v_return_junction._4_4_ = *(undefined4 *)((long)&ptVar2->v_return_junction + 4);
  local_80.v_return_stack = ptVar2->v_return_stack;
  local_80.v_return_is_tail = ptVar2->v_return_is_tail;
  a_emit->v_targets = &local_80;
  puVar3 = (this->v_block).
           super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80.v_break = pvVar4;
  local_80.v_break_junction = a_junction_00;
  local_80.v_break_is_tail = a_tail;
  local_80.v_break_must_clear = a_clear;
  local_80.v_continue = a_label;
  local_80.v_continue_junction = a_junction;
  for (puVar5 = (this->v_block).
                super__Vector_base<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>,_std::allocator<std::unique_ptr<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar3; puVar5 = puVar5 + 1) {
    ptVar1 = (puVar5->_M_t).
             super___uniq_ptr_impl<xemmai::ast::t_node,_std::default_delete<xemmai::ast::t_node>_>.
             _M_t.
             super__Tuple_impl<0UL,_xemmai::ast::t_node_*,_std::default_delete<xemmai::ast::t_node>_>
             .super__Head_base<0UL,_xemmai::ast::t_node_*,_false>._M_head_impl;
    (*ptVar1->_vptr_t_node[3])(ptVar1,a_emit,0,0,1);
  }
  a_emit->v_targets = ptVar2;
  local_88 = *t_code::v_labels;
  std::vector<void*,std::allocator<void*>>::emplace_back<void*>
            ((vector<void*,std::allocator<void*>> *)&a_emit->v_code->v_instructions,&local_88);
  t_emit::operator<<(a_emit,a_label);
  a_label_00->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  t_emit::f_join(a_emit,a_junction_00);
  if (!a_clear) {
    t_emit::f_emit_null(a_emit);
  }
  pvVar4->v_target =
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(a_emit->v_code->v_instructions).super__Vector_base<void_*,_std::allocator<void_*>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  t_emit::f_merge(a_emit,a_junction_00);
  tVar6.field_1.v_integer = extraout_RDX.v_integer;
  tVar6._0_8_ = 4;
  return tVar6;
}

Assistant:

t_operand t_while::f_emit(t_emit& a_emit, bool a_tail, bool a_operand, bool a_clear)
{
	a_emit.f_join(v_junction_condition);
	auto& loop = a_emit.f_label();
	a_emit.f_target(loop);
	a_emit.f_merge(v_junction_condition);
	v_condition->f_emit(a_emit, false, false);
	auto& label0 = a_emit.f_label();
	a_emit.f_pop();
	a_emit << c_instruction__BRANCH << a_emit.v_stack << label0;
	auto targets0 = a_emit.v_targets;
	auto& break0 = a_emit.f_label();
	t_emit::t_targets targets1{&break0, &v_junction_exit, a_emit.v_stack, a_tail, a_clear, &loop, &v_junction_condition, targets0->v_return, targets0->v_return_junction, targets0->v_return_stack, targets0->v_return_is_tail};
	a_emit.v_targets = &targets1;
	f_emit_block_without_value(a_emit, v_block);
	a_emit.v_targets = targets0;
	a_emit << c_instruction__JUMP << loop;
	a_emit.f_target(label0);
	a_emit.f_join(v_junction_exit);
	if (!a_clear) a_emit.f_emit_null();
	a_emit.f_target(break0);
	a_emit.f_merge(v_junction_exit);
	return {};
}